

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpyfldin_s.c
# Opt level: O3

errno_t strcpyfldin_s(char *dest,rsize_t dmax,char *src,rsize_t slen)

{
  long lVar1;
  errno_t error;
  errno_t eVar2;
  rsize_t rVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    pcVar4 = "strcpyfldin_s: dest is null";
LAB_00104cdc:
    eVar2 = 400;
    error = 400;
  }
  else if (dmax == 0) {
    pcVar4 = "strcpyfldin_s: dmax is 0";
LAB_00104cf1:
    eVar2 = 0x191;
    error = 0x191;
  }
  else {
    if (dmax < 0x10000001) {
      if (src == (char *)0x0) {
        memset(dest,0,dmax);
        pcVar4 = "strcpyfldin_s: src is null";
        goto LAB_00104cdc;
      }
      if (slen == 0) {
        memset(dest,0,dmax);
        pcVar4 = "strcpyfldin_s: slen is 0";
        goto LAB_00104cf1;
      }
      if (slen <= dmax) {
        if (dest < src) {
          rVar3 = 0;
          eVar2 = 0;
          do {
            pcVar4 = dest + rVar3;
            if (src[rVar3] == '\0') goto LAB_00104de8;
            if (pcVar4 == src) goto LAB_00104db8;
            *pcVar4 = src[rVar3];
            rVar3 = rVar3 + 1;
          } while (dmax != rVar3);
        }
        else {
          rVar3 = 0;
          eVar2 = 0;
          do {
            if (src[rVar3] == '\0') {
              pcVar4 = dest + rVar3;
              goto LAB_00104de8;
            }
            if (src + rVar3 == dest) goto LAB_00104db8;
            dest[rVar3] = src[rVar3];
            rVar3 = rVar3 + 1;
          } while (dmax != rVar3);
        }
        goto LAB_00104d02;
      }
      memset(dest,0,dmax);
      pcVar4 = "strcpyfldin_s: slen exceeds max";
    }
    else {
      pcVar4 = "strcpyfldin_s: dmax exceeds max";
    }
    eVar2 = 0x193;
    error = 0x193;
  }
  goto LAB_00104cfd;
LAB_00104de8:
  eVar2 = 0;
  memset(pcVar4,0,dmax - rVar3);
  goto LAB_00104d02;
LAB_00104db8:
  memset(dest,0,dmax);
  pcVar4 = "strcpyfldin_s: overlapping objects";
  eVar2 = 0x194;
  error = 0x194;
LAB_00104cfd:
  invoke_safe_str_constraint_handler(pcVar4,(void *)0x0,error);
LAB_00104d02:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return eVar2;
}

Assistant:

errno_t
strcpyfldin_s (char *dest, rsize_t dmax, const char *src, rsize_t slen)
{
    rsize_t orig_dmax;
    char *orig_dest;
    const char *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    if (src == NULL) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (slen == 0) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: slen is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (slen > dmax) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: slen exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }


    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest < src) {
        overlap_bumper = src;

        while (dmax > 0 && *src) {

            if (dest == overlap_bumper) {
                dmax = orig_dmax;
                dest = orig_dest;

                /* null string to eliminate partial copy */
                while (dmax) { *dest = '\0'; dmax--; dest++; }

                invoke_safe_str_constraint_handler(
                          "strcpyfldin_s: overlapping objects",
                           NULL, ESOVRLP);
                return (ESOVRLP);
            }

            dmax--;
            *dest++ = *src++;
        }

    } else {
        overlap_bumper = dest;

        while (dmax > 0 && *src) {

            if (src == overlap_bumper) {
                dmax = orig_dmax;
                dest = orig_dest;

                /* null string to eliminate partial copy */
                while (dmax) { *dest = '\0'; dmax--; dest++; }

                invoke_safe_str_constraint_handler(
                          "strcpyfldin_s: overlapping objects",
                           NULL, ESOVRLP);
                return (ESOVRLP);
            }

            dmax--;
            *dest++ = *src++;
        }
    }

    /*
     * finish filling in the field with nulls if there is slack space
     */
    while (dmax) { *dest = '\0'; dmax--; dest++; }

    return (EOK);
}